

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sessions.c
# Opt level: O0

int cueify_sessions_deserialize(cueify_sessions *s,uint8_t *buffer,size_t size)

{
  uint8_t *bp;
  uint16_t sessions_length;
  cueify_sessions_private *sessions;
  size_t size_local;
  uint8_t *buffer_local;
  cueify_sessions *s_local;
  
  if ((s == (cueify_sessions *)0x0) || (buffer == (uint8_t *)0x0)) {
    s_local._4_4_ = 3;
  }
  else if (size < 4) {
    s_local._4_4_ = 6;
  }
  else if (size - 2 < (ulong)CONCAT11(*buffer,buffer[1])) {
    s_local._4_4_ = 6;
  }
  else if (CONCAT11(*buffer,buffer[1]) == 10) {
    memset(s,0,0xc);
    *(uint8_t *)s = buffer[2];
    *(uint8_t *)((long)s + 1) = buffer[3];
    *(char *)((long)s + 2) = (char)((int)(uint)buffer[5] >> 4);
    *(byte *)((long)s + 3) = buffer[5] & 0xf;
    *(uint8_t *)((long)s + 4) = buffer[6];
    *(uint *)(s + 1) =
         (uint)buffer[8] << 0x18 | (uint)buffer[9] << 0x10 | (uint)buffer[10] << 8 |
         (uint)buffer[0xb];
    s_local._4_4_ = 0;
  }
  else {
    s_local._4_4_ = 7;
  }
  return s_local._4_4_;
}

Assistant:

int cueify_sessions_deserialize(cueify_sessions *s,
				const uint8_t * const buffer,
				size_t size) {
    cueify_sessions_private *sessions = (cueify_sessions_private *)s;
    uint16_t sessions_length;
    const uint8_t *bp;

    if (s == NULL || buffer == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    if (size < 4) {
	return CUEIFY_ERR_TRUNCATED;
    }

    /* TOC Data Length */
    sessions_length = ((buffer[0] << 8) | buffer[1]);
    if (size - 2 < sessions_length) {
	return CUEIFY_ERR_TRUNCATED;
    }
    if (sessions_length != 10) {
	return CUEIFY_ERR_CORRUPTED;
    }

    memset(sessions, 0, sizeof(cueify_sessions_private));

    /* First Complete Session Number */
    sessions->first_session_number = buffer[2];
    /* Last Complete Session Number */
    sessions->last_session_number = buffer[3];

    /* TOC Track Descriptor */
    bp = buffer + 4;
    /* Reserved */
    bp++;
    /* ADR */
    sessions->track_adr = *bp >> 4;
    /* CONTROL */
    sessions->track_control = *bp & 0xF;
    bp++;
    /* First Track Number in Last Complete Session */
    sessions->track_number = *bp++;
    /* Reserved */
    bp++;
    /* Start Address of First Track in Last Session (LBA) */
    sessions->track_lba = ((bp[0] << 24) |
			   (bp[1] << 16) |
			   (bp[2] << 8)  | 
			   (bp[3]));

    return CUEIFY_OK;
}